

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O0

void paeth_predictor(uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left)

{
  uint16_t uVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  uint8_t ytop_left;
  int c;
  int r;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 local_8;
  
  local_8 = in_RDI;
  for (local_2c = 0; local_2c < in_ECX; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < in_EDX; local_30 = local_30 + 1) {
      uVar1 = paeth_predictor_single
                        ((uint16_t)((ulong)in_R8 >> 0x30),(uint16_t)((ulong)in_R8 >> 0x20),
                         (uint16_t)((ulong)in_R8 >> 0x10));
      *(char *)(local_8 + local_30) = (char)uVar1;
    }
    local_8 = in_RSI + local_8;
  }
  return;
}

Assistant:

static inline void paeth_predictor(uint8_t *dst, ptrdiff_t stride, int bw,
                                   int bh, const uint8_t *above,
                                   const uint8_t *left) {
  int r, c;
  const uint8_t ytop_left = above[-1];

  for (r = 0; r < bh; r++) {
    for (c = 0; c < bw; c++)
      dst[c] = (uint8_t)paeth_predictor_single(left[r], above[c], ytop_left);
    dst += stride;
  }
}